

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::ConvertIntArg<unsigned_char>
               (uchar v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  Nonnull<char_*> pcVar2;
  FormatSinkImpl *in_R8;
  wchar_t v_00;
  IntDigits *buffer;
  string_view v_01;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  FormatConversionSpecImpl local_70;
  IntDigits *local_60;
  size_t local_58;
  undefined1 local_26 [2];
  char local_24 [4];
  
  conv_02._0_4_ = conv.precision_;
  conv_01._0_8_ = conv._0_8_;
  v_00 = conv._0_4_;
  local_70._0_8_ = conv_01._0_8_;
  local_70.precision_ = conv_02._0_4_;
  switch(conv_01._0_8_ & 0xff) {
  case 0:
    conv_02.precision_ = (int)sink;
    if ((v_00 & 0xff0000U) != 0x20000) {
      conv_01.precision_ = conv_02.precision_;
      anon_unknown_53::ConvertCharImpl
                (v,conv_01,(FormatSinkImpl *)&switchD_002ca97c::switchdataD_003ab868);
      return true;
    }
    conv_02.width_ = 0;
    bVar1 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)(ulong)v,v_00,conv_02,in_R8);
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned char]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    buffer = (IntDigits *)&stack0xffffffffffffffb0;
    local_60 = buffer;
    pcVar2 = numbers_internal::FastIntToBuffer((uint)v,(Nonnull<char_*>)buffer);
    goto LAB_002caa69;
  case 4:
    buffer = (IntDigits *)local_24;
    do {
      *(byte *)((long)buffer + -1) = v & 7 | 0x30;
      buffer = (IntDigits *)((long)buffer + -1);
      bVar1 = 7 < v;
      v = v >> 3;
    } while (bVar1);
    break;
  case 6:
    local_26 = *(undefined1 (*) [2])(numbers_internal::kHexTable + (ulong)v * 2);
    buffer = (IntDigits *)(local_26 + 1);
    if (local_26[0] != '0') {
      buffer = (IntDigits *)local_26;
    }
    pcVar2 = local_24;
    local_60 = buffer;
    goto LAB_002caa69;
  case 7:
    buffer = (IntDigits *)local_24;
    do {
      *(char *)((long)buffer + -1) = "0123456789ABCDEF"[v & 0xf];
      buffer = (IntDigits *)((long)buffer + -1);
      bVar1 = 0xf < v;
      v = v >> 4;
    } while (bVar1);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar1 = ConvertFloatImpl((double)v,&local_70,sink);
    return bVar1;
  }
  pcVar2 = local_24;
  local_60 = buffer;
LAB_002caa69:
  conv_00._0_8_ = (long)pcVar2 - (long)buffer;
  local_58 = conv_00._0_8_;
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_01._M_str = (char *)local_60;
    v_01._M_len = conv_00._0_8_;
    FormatSinkImpl::Append(sink,v_01);
  }
  else {
    conv_00.precision_ = v_00;
    anon_unknown_53::ConvertIntImplInnerSlow
              (local_60,conv_00,(FormatSinkImpl *)(ulong)conv_02._0_4_);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}